

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::NeedBailOutOnImplicitCallsForTypedArrayStore(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  IndirOpnd *this_00;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  byte local_34;
  bool local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  Opnd *local_30;
  Opnd *opnd;
  Instr *local_20;
  Instr *instr_local;
  BackwardPass *this_local;
  
  local_20 = instr;
  instr_local = (Instr *)this;
  if ((instr->m_opcode == StElemI_A) || (local_33 = false, instr->m_opcode == StElemI_A_Strict)) {
    pOVar3 = IR::Instr::GetDst(instr);
    bVar2 = IR::Opnd::IsIndirOpnd(pOVar3);
    local_33 = false;
    if (bVar2) {
      pOVar3 = IR::Instr::GetDst(local_20);
      this_00 = IR::Opnd::AsIndirOpnd(pOVar3);
      pRVar4 = IR::IndirOpnd::GetBaseOpnd(this_00);
      opnd._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   IR::Opnd::GetValueType(&pRVar4->super_Opnd);
      local_33 = ValueType::IsLikelyTypedArray((ValueType *)((long)&opnd + 6));
    }
  }
  if (local_33 != false) {
    local_30 = IR::Instr::GetSrc1(local_20);
    bVar2 = IR::Opnd::IsRegOpnd(local_30);
    if (bVar2) {
      pRVar4 = IR::Opnd::AsRegOpnd(local_30);
      local_32.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&pRVar4->super_Opnd);
      bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
      local_34 = 0;
      if (!bVar2) {
        pRVar4 = IR::Opnd::AsRegOpnd(local_30);
        bVar2 = StackSym::IsInt32(pRVar4->m_sym);
        local_34 = 0;
        if (!bVar2) {
          pRVar4 = IR::Opnd::AsRegOpnd(local_30);
          bVar2 = StackSym::IsFloat64(pRVar4->m_sym);
          local_34 = 0;
          if (!bVar2) {
            pRVar4 = IR::Opnd::AsRegOpnd(local_30);
            bVar2 = StackSym::IsFloatConst(pRVar4->m_sym);
            local_34 = 0;
            if (!bVar2) {
              pRVar4 = IR::Opnd::AsRegOpnd(local_30);
              bVar2 = StackSym::IsIntConst(pRVar4->m_sym);
              local_34 = bVar2 ^ 0xff;
            }
          }
        }
      }
      return (bool)(local_34 & 1);
    }
    bVar2 = IR::Opnd::IsIntConstOpnd(local_30);
    if ((((!bVar2) && (bVar2 = IR::Opnd::IsInt64ConstOpnd(local_30), !bVar2)) &&
        (bVar2 = IR::Opnd::IsFloat32ConstOpnd(local_30), !bVar2)) &&
       ((bVar2 = IR::Opnd::IsFloatConstOpnd(local_30), !bVar2 &&
        (bVar2 = IR::Opnd::IsAddrOpnd(local_30), !bVar2)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa0f,
                         "(opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd())"
                         ,
                         "opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::NeedBailOutOnImplicitCallsForTypedArrayStore(IR::Instr* instr)
{
    if ((instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict) &&
        instr->GetDst()->IsIndirOpnd() &&
        instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyTypedArray())
    {
        IR::Opnd * opnd = instr->GetSrc1();
        if (opnd->IsRegOpnd())
        {
            return !opnd->AsRegOpnd()->GetValueType().IsPrimitive() &&
                !opnd->AsRegOpnd()->m_sym->IsInt32() &&
                !opnd->AsRegOpnd()->m_sym->IsFloat64() &&
                !opnd->AsRegOpnd()->m_sym->IsFloatConst() &&
                !opnd->AsRegOpnd()->m_sym->IsIntConst();
        }
        else
        {
            Assert(opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd());
        }
    }
    return false;
}